

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APIntOps::RoundingUDiv(APIntOps *this,APInt *A,APInt *B,Rounding RM)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  anon_union_8_2_1313ab2f_for_U *this_00;
  ulong __n;
  APInt AVar3;
  APInt Rem;
  anon_union_8_2_1313ab2f_for_U local_48;
  uint local_40;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  anon_union_8_2_1313ab2f_for_U local_28;
  uint local_20;
  undefined8 uVar2;
  
  this_00 = &local_48;
  if (RM < UP) {
    AVar3 = APInt::udiv((APInt *)this,A);
    uVar2 = AVar3._8_8_;
  }
  else {
    if (RM != UP) {
      llvm_unreachable_internal
                ("Unknown APInt::Rounding enum",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                 ,0xa76);
    }
    local_40 = 1;
    local_48.VAL = 0;
    local_20 = 1;
    local_28.VAL = 0;
    APInt::udivrem(A,B,(APInt *)&local_48,(APInt *)&local_28);
    bVar1 = APInt::operator==((APInt *)&local_28,0);
    if (bVar1) {
      *(uint *)(this + 8) = local_40;
      uVar2 = extraout_RDX;
    }
    else {
      local_30 = local_40;
      if (local_40 < 0x41) {
        local_38.VAL = local_48.VAL;
      }
      else {
        __n = (ulong)((uint)((ulong)local_40 + 0x3f >> 3) & 0xfffffff8);
        local_38.pVal = (uint64_t *)operator_new__(__n);
        memcpy(local_38.pVal,local_48.pVal,__n);
      }
      this_00 = &local_38;
      APInt::operator+=((APInt *)this_00,1);
      *(uint *)(this + 8) = local_30;
      uVar2 = extraout_RDX_00;
    }
    *(anon_union_8_2_1313ab2f_for_U *)this = *this_00;
    *(uint *)(this_00 + 1) = 0;
    if ((0x40 < local_20) && ((void *)local_28.VAL != (void *)0x0)) {
      operator_delete__(local_28.pVal);
      uVar2 = extraout_RDX_01;
    }
    if ((0x40 < local_40) && ((void *)local_48.VAL != (void *)0x0)) {
      operator_delete__(local_48.pVal);
      uVar2 = extraout_RDX_02;
    }
  }
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt llvm::APIntOps::RoundingUDiv(const APInt &A, const APInt &B,
                                   APInt::Rounding RM) {
  // Currently udivrem always rounds down.
  switch (RM) {
  case APInt::Rounding::DOWN:
  case APInt::Rounding::TOWARD_ZERO:
    return A.udiv(B);
  case APInt::Rounding::UP: {
    APInt Quo, Rem;
    APInt::udivrem(A, B, Quo, Rem);
    if (Rem == 0)
      return Quo;
    return Quo + 1;
  }
  }
  llvm_unreachable("Unknown APInt::Rounding enum");
}